

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jumptable.cc
# Opt level: O0

uintb JumpBasic::backup2Switch(Funcdata *fd,uintb output,Varnode *outvn,Varnode *invn)

{
  bool bVar1;
  int4 iVar2;
  uint4 uVar3;
  int4 iVar4;
  PcodeOp *this;
  TypeOp *this_00;
  Varnode *pVVar5;
  Address *this_01;
  AddrSpace *spc;
  Architecture *pAVar6;
  uintb offset;
  LowlevelError *this_02;
  allocator local_a9;
  string local_a8 [48];
  undefined1 local_78 [8];
  MemoryImage mem;
  uintb otherval;
  Address *addr;
  int4 slot;
  TypeOp *top;
  PcodeOp *op;
  Varnode *curvn;
  Varnode *invn_local;
  Varnode *outvn_local;
  uintb output_local;
  Funcdata *fd_local;
  
  op = (PcodeOp *)outvn;
  outvn_local = (Varnode *)output;
  do {
    if ((Varnode *)op == invn) {
      return (uintb)outvn_local;
    }
    this = Varnode::getDef((Varnode *)op);
    this_00 = PcodeOp::getOpcode(this);
    for (addr._4_4_ = 0; iVar2 = PcodeOp::numInput(this), addr._4_4_ < iVar2;
        addr._4_4_ = addr._4_4_ + 1) {
      pVVar5 = PcodeOp::getIn(this,addr._4_4_);
      bVar1 = Varnode::isConstant(pVVar5);
      if (!bVar1) break;
    }
    uVar3 = PcodeOp::getEvalType(this);
    if (uVar3 == 0x10000) {
      pVVar5 = PcodeOp::getIn(this,1 - addr._4_4_);
      this_01 = Varnode::getAddr(pVVar5);
      bVar1 = Address::isConstant(this_01);
      if (bVar1) {
        mem.loader = (LoadImage *)Address::getOffset(this_01);
      }
      else {
        spc = Address::getSpace(this_01);
        pAVar6 = Funcdata::getArch(fd);
        MemoryImage::MemoryImage((MemoryImage *)local_78,spc,4,0x400,pAVar6->loader);
        offset = Address::getOffset(this_01);
        pVVar5 = PcodeOp::getIn(this,1 - addr._4_4_);
        iVar2 = Varnode::getSize(pVVar5);
        mem.loader = (LoadImage *)MemoryBank::getValue((MemoryBank *)local_78,offset,iVar2);
        MemoryImage::~MemoryImage((MemoryImage *)local_78);
      }
      pVVar5 = PcodeOp::getOut(this);
      iVar2 = Varnode::getSize(pVVar5);
      pVVar5 = PcodeOp::getIn(this,addr._4_4_);
      iVar4 = Varnode::getSize(pVVar5);
      outvn_local = (Varnode *)
                    TypeOp::recoverInputBinary
                              (this_00,addr._4_4_,iVar2,(uintb)outvn_local,iVar4,(uintb)mem.loader);
      op = (PcodeOp *)PcodeOp::getIn(this,addr._4_4_);
    }
    else {
      uVar3 = PcodeOp::getEvalType(this);
      if (uVar3 != 0x8000) {
        this_02 = (LowlevelError *)__cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a8,"Bad switch normalization op",&local_a9);
        LowlevelError::LowlevelError(this_02,(string *)local_a8);
        __cxa_throw(this_02,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
      }
      pVVar5 = PcodeOp::getOut(this);
      iVar2 = Varnode::getSize(pVVar5);
      pVVar5 = PcodeOp::getIn(this,addr._4_4_);
      iVar4 = Varnode::getSize(pVVar5);
      outvn_local = (Varnode *)TypeOp::recoverInputUnary(this_00,iVar2,(uintb)outvn_local,iVar4);
      op = (PcodeOp *)PcodeOp::getIn(this,addr._4_4_);
    }
  } while( true );
}

Assistant:

uintb JumpBasic::backup2Switch(Funcdata *fd,uintb output,Varnode *outvn,Varnode *invn)

{ // Back up constant normalized value -outvn- to unnormalized
  Varnode *curvn = outvn;
  PcodeOp *op;
  TypeOp *top;
  int4 slot;

  while(curvn != invn) {
    op = curvn->getDef();
    top = op->getOpcode();
    for(slot=0;slot<op->numInput();++slot) // Find first non-constant input
      if (!op->getIn(slot)->isConstant()) break;
    if (op->getEvalType() == PcodeOp::binary) {
      const Address &addr(op->getIn(1-slot)->getAddr());
      uintb otherval;
      if (!addr.isConstant()) {
	MemoryImage mem(addr.getSpace(),4,1024,fd->getArch()->loader);
	otherval = mem.getValue(addr.getOffset(),op->getIn(1-slot)->getSize());
      }
      else
	otherval = addr.getOffset();
      output = top->recoverInputBinary(slot,op->getOut()->getSize(),output,
				       op->getIn(slot)->getSize(),otherval);
      curvn = op->getIn(slot);
    }
    else if (op->getEvalType() == PcodeOp::unary) {
      output = top->recoverInputUnary(op->getOut()->getSize(),output,op->getIn(slot)->getSize());
      curvn = op->getIn(slot);
    }
    else
      throw LowlevelError("Bad switch normalization op");
  }
  return output;
}